

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf.cxx
# Opt level: O3

xr_ogf * xray_re::xr_ogf::load_ogf(string *path)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  int iVar3;
  xr_reader *this;
  size_t sVar4;
  xr_ogf_v4 *this_00;
  
  if ((xr_file_system::instance()::instance0 == '\0') &&
     (iVar3 = __cxa_guard_acquire(&xr_file_system::instance()::instance0), iVar3 != 0)) {
    xr_file_system::xr_file_system(&xr_file_system::instance::instance0);
    __cxa_atexit(xr_file_system::~xr_file_system,&xr_file_system::instance::instance0,&__dso_handle)
    ;
    __cxa_guard_release(&xr_file_system::instance()::instance0);
  }
  this = xr_file_system::r_open(&xr_file_system::instance::instance0,(path->_M_dataplus)._M_p);
  if (this == (xr_reader *)0x0) {
    return (xr_ogf *)0x0;
  }
  sVar4 = xr_reader::find_chunk(this,1);
  if (sVar4 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf.cxx"
                  ,0x44,"static xr_ogf *xray_re::xr_ogf::load_ogf(const std::string &)");
  }
  puVar2 = (this->field_2).m_p;
  (this->field_2).m_p = puVar2 + 1;
  uVar1 = *puVar2;
  if (uVar1 == '\x04') {
    this_00 = (xr_ogf_v4 *)operator_new(0x7b8);
    xr_ogf_v4::xr_ogf_v4(this_00);
  }
  else {
    if (uVar1 != '\x03') {
      this_00 = (xr_ogf_v4 *)0x0;
      msg("load_ogf: unknown version %u");
      goto LAB_0017c8f6;
    }
    this_00 = (xr_ogf_v4 *)operator_new(0x770);
    xr_ogf_v3::xr_ogf_v3((xr_ogf_v3 *)this_00);
  }
  std::__cxx11::string::_M_assign((string *)&(this_00->super_xr_ogf).m_path);
  (*(this_00->super_xr_ogf).super_xr_object.super_xr_surface_factory._vptr_xr_surface_factory[0x15])
            (this_00,this);
LAB_0017c8f6:
  (*this->_vptr_xr_reader[1])(this);
  return &this_00->super_xr_ogf;
}

Assistant:

xr_ogf* xr_ogf::load_ogf(const std::string& path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path);
	if (r == 0)
		return 0;

	xr_ogf* ogf = 0;
	if (!r->find_chunk(OGF_HEADER))
		xr_not_expected();

	unsigned version = r->r_u8();
	if (version == OGF3_VERSION) {
		ogf = new xr_ogf_v3();
	} else if (version == OGF4_VERSION) {
		ogf = new xr_ogf_v4();
	} else {
		msg("load_ogf: unknown version %u", version);
	}
	if (ogf) {
		try {
			ogf->m_path = path;
			ogf->load_ogf(*r);
		} catch (xr_error) {
			delete ogf;
			ogf = 0;
		}
	}
	fs.r_close(r);
	return ogf;
}